

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FoldingSet.cpp
# Opt level: O1

void __thiscall llvm::FoldingSetBase::GrowBucketCount(FoldingSetBase *this,uint NewBucketCount)

{
  uint uVar1;
  void **__ptr;
  Node *pNVar2;
  uint uVar3;
  void **ppvVar4;
  ulong uVar5;
  Node *N;
  FoldingSetNodeID TempID;
  undefined1 *local_c0;
  undefined4 local_b8;
  undefined4 uStack_b4;
  undefined1 local_b0 [128];
  
  uVar1 = this->NumBuckets;
  if (NewBucketCount <= uVar1) {
    __assert_fail("(NewBucketCount > NumBuckets) && \"Can\'t shrink a folding set with GrowBucketCount\""
                  ,
                  "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/llvm/Support/FoldingSet.cpp"
                  ,0x10f,"void llvm::FoldingSetBase::GrowBucketCount(unsigned int)");
  }
  if ((NewBucketCount & NewBucketCount - 1) != 0) {
    __assert_fail("isPowerOf2_32(NewBucketCount) && \"Bad bucket count!\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/llvm/Support/FoldingSet.cpp"
                  ,0x110,"void llvm::FoldingSetBase::GrowBucketCount(unsigned int)");
  }
  __ptr = this->Buckets;
  ppvVar4 = AllocateBuckets(NewBucketCount);
  this->Buckets = ppvVar4;
  this->NumBuckets = NewBucketCount;
  this->NumNodes = 0;
  local_c0 = local_b0;
  uStack_b4 = 0x20;
  if ((ulong)uVar1 != 0) {
    uVar5 = 0;
    do {
      N = (Node *)__ptr[uVar5];
      if (N != (Node *)0x0) {
        while (local_b8 = 0, N != (Node *)0x0 && ((ulong)N & 1) == 0) {
          pNVar2 = (Node *)N->NextInFoldingSetBucket;
          N->NextInFoldingSetBucket = (void *)0x0;
          uVar3 = (*this->_vptr_FoldingSetBase[3])(this,N,&local_c0);
          InsertNode(this,N,this->Buckets + (this->NumBuckets - 1 & uVar3));
          N = pNVar2;
        }
      }
      uVar5 = uVar5 + 1;
    } while (uVar5 != uVar1);
  }
  local_b8 = 0;
  free(__ptr);
  if (local_c0 != local_b0) {
    free(local_c0);
  }
  return;
}

Assistant:

void FoldingSetBase::GrowBucketCount(unsigned NewBucketCount) {
  assert((NewBucketCount > NumBuckets) && "Can't shrink a folding set with GrowBucketCount");
  assert(isPowerOf2_32(NewBucketCount) && "Bad bucket count!");
  void **OldBuckets = Buckets;
  unsigned OldNumBuckets = NumBuckets;

  // Clear out new buckets.
  Buckets = AllocateBuckets(NewBucketCount);
  // Set NumBuckets only if allocation of new buckets was successful.
  NumBuckets = NewBucketCount;
  NumNodes = 0;

  // Walk the old buckets, rehashing nodes into their new place.
  FoldingSetNodeID TempID;
  for (unsigned i = 0; i != OldNumBuckets; ++i) {
    void *Probe = OldBuckets[i];
    if (!Probe) continue;
    while (Node *NodeInBucket = GetNextPtr(Probe)) {
      // Figure out the next link, remove NodeInBucket from the old link.
      Probe = NodeInBucket->getNextInBucket();
      NodeInBucket->SetNextInBucket(nullptr);

      // Insert the node into the new bucket, after recomputing the hash.
      InsertNode(NodeInBucket,
                 GetBucketFor(ComputeNodeHash(NodeInBucket, TempID),
                              Buckets, NumBuckets));
      TempID.clear();
    }
  }

  free(OldBuckets);
}